

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ActivationParametricSoftplus::MergeFrom
          (ActivationParametricSoftplus *this,ActivationParametricSoftplus *from)

{
  void *pvVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x16b8);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_) &&
     (from->alpha_ != (WeightParams *)0x0)) {
    if (this->alpha_ == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->alpha_ = pWVar2;
    }
    pWVar2 = from->alpha_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->alpha_,pWVar2);
  }
  if ((from != (ActivationParametricSoftplus *)&_ActivationParametricSoftplus_default_instance_) &&
     (from->beta_ != (WeightParams *)0x0)) {
    if (this->beta_ == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->beta_ = pWVar2;
    }
    pWVar2 = from->beta_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(this->beta_,pWVar2);
  }
  return;
}

Assistant:

void ActivationParametricSoftplus::MergeFrom(const ActivationParametricSoftplus& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ActivationParametricSoftplus)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_alpha()) {
    mutable_alpha()->::CoreML::Specification::WeightParams::MergeFrom(from.alpha());
  }
  if (from.has_beta()) {
    mutable_beta()->::CoreML::Specification::WeightParams::MergeFrom(from.beta());
  }
}